

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_traits.h
# Opt level: O3

optional<const_google::protobuf::FieldDescriptor_*> __thiscall
google::protobuf::json_internal::Proto2Descriptor::FieldByName
          (Proto2Descriptor *this,Desc *d,string_view name)

{
  _Storage<const_google::protobuf::FieldDescriptor_*,_true> _Var1;
  int iVar2;
  _Storage<const_google::protobuf::FieldDescriptor_*,_true> _Var3;
  ulong uVar4;
  undefined8 unaff_RBX;
  ulong uVar5;
  long lVar6;
  long lVar7;
  string_view camelcase_name;
  string_view name_00;
  optional<const_google::protobuf::FieldDescriptor_*> oVar8;
  
  camelcase_name._M_str = (char *)name._M_len;
  camelcase_name._M_len = (size_t)d;
  _Var3._M_value = Descriptor::FindFieldByCamelcaseName((Descriptor *)this,camelcase_name);
  uVar5 = CONCAT71((int7)((ulong)unaff_RBX >> 8),1);
  if ((_Var3._M_value == (FieldDescriptor *)0x0) &&
     (name_00._M_str = camelcase_name._M_str, name_00._M_len = (size_t)d,
     _Var3._M_value = Descriptor::FindFieldByName((Descriptor *)this,name_00),
     _Var3._M_value == (FieldDescriptor *)0x0)) {
    lVar6 = (long)*(int *)(this + 4);
    if (0 < lVar6) {
      _Var1 = (_Storage<const_google::protobuf::FieldDescriptor_*,_true>)
              ((_Storage<const_google::protobuf::FieldDescriptor_*,_true> *)(this + 0x38))->_M_value
      ;
      lVar7 = 0;
      _Var3 = _Var1;
      do {
        if (((_Var3._M_value)->field_0x1 & 4) != 0) {
          uVar4 = (ulong)((byte)(_Var3._M_value)->field_0x3 & 0x70);
          if (*(Desc **)((long)&(_Var3._M_value)->all_names_->_M_string_length + uVar4 * 2) == d) {
            if (d == (Desc *)0x0) goto LAB_002c87e0;
            iVar2 = bcmp(*(void **)((long)&((_Var3._M_value)->all_names_->_M_dataplus)._M_p +
                                   uVar4 * 2),camelcase_name._M_str,(size_t)d);
            if (iVar2 == 0) {
              _Var3._M_value = _Var1._M_value + lVar7;
              goto LAB_002c87e0;
            }
          }
        }
        lVar7 = lVar7 + 1;
        _Var3._M_value = _Var3._M_value + 1;
        lVar6 = lVar6 + -1;
      } while (lVar6 != 0);
    }
    _Var3._M_value = (FieldDescriptor *)0x0;
    uVar5 = 0;
  }
LAB_002c87e0:
  oVar8.super__Optional_base<const_google::protobuf::FieldDescriptor_*,_true,_true>._M_payload.
  super__Optional_payload_base<const_google::protobuf::FieldDescriptor_*>._8_8_ = uVar5 & 0xffffffff
  ;
  oVar8.super__Optional_base<const_google::protobuf::FieldDescriptor_*,_true,_true>._M_payload.
  super__Optional_payload_base<const_google::protobuf::FieldDescriptor_*>._M_payload._M_value =
       _Var3._M_value;
  return (optional<const_google::protobuf::FieldDescriptor_*>)
         oVar8.super__Optional_base<const_google::protobuf::FieldDescriptor_*,_true,_true>.
         _M_payload.super__Optional_payload_base<const_google::protobuf::FieldDescriptor_*>;
}

Assistant:

static absl::optional<Field> FieldByName(const Desc& d,
                                           absl::string_view name) {
    if (const auto* field = d.FindFieldByCamelcaseName(name)) {
      return field;
    }

    if (const auto* field = d.FindFieldByName(name)) {
      return field;
    }

    for (int i = 0; i < d.field_count(); ++i) {
      const auto* field = d.field(i);
      if (field->has_json_name() && field->json_name() == name) {
        return field;
      }
    }

    return absl::nullopt;
  }